

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall
server_context::send_error(server_context *this,int id_task,string *error,error_type type)

{
  uint uVar1;
  common_log *log;
  undefined8 uVar2;
  pointer psVar3;
  server_response *this_00;
  error_type in_ECX;
  size_t __n;
  string *in_RDX;
  void *__buf;
  uint in_ESI;
  long in_RDI;
  int in_R8D;
  __single_object res;
  unique_ptr<server_task_result_error,_std::default_delete<server_task_result_error>_> *__u;
  unique_ptr<server_task_result_error,_std::default_delete<server_task_result_error>_> local_40 [4];
  error_type local_1c;
  string *local_18;
  uint local_c;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  if (-1 < common_log_verbosity_thold) {
    log = common_log_main();
    uVar1 = local_c;
    uVar2 = std::__cxx11::string::c_str();
    in_R8D = 0x445db8;
    common_log_add(log,GGML_LOG_LEVEL_ERROR,"srv  %12.*s: task id = %d, error: %s\n",0xc,
                   "send_error",(ulong)uVar1,uVar2);
  }
  httplib::detail::std::make_unique<server_task_result_error>();
  psVar3 = httplib::detail::std::
           unique_ptr<server_task_result_error,_std::default_delete<server_task_result_error>_>::
           operator->((unique_ptr<server_task_result_error,_std::default_delete<server_task_result_error>_>
                       *)0x29c3d2);
  (psVar3->super_server_task_result).id = local_c;
  psVar3 = httplib::detail::std::
           unique_ptr<server_task_result_error,_std::default_delete<server_task_result_error>_>::
           operator->((unique_ptr<server_task_result_error,_std::default_delete<server_task_result_error>_>
                       *)0x29c3eb);
  __n = (size_t)local_1c;
  psVar3->err_type = local_1c;
  psVar3 = httplib::detail::std::
           unique_ptr<server_task_result_error,_std::default_delete<server_task_result_error>_>::
           operator->((unique_ptr<server_task_result_error,_std::default_delete<server_task_result_error>_>
                       *)0x29c406);
  std::__cxx11::string::operator=((string *)&psVar3->err_msg,local_18);
  this_00 = (server_response *)(in_RDI + 0x15d8);
  __u = local_40;
  std::unique_ptr<server_task_result,std::default_delete<server_task_result>>::
  unique_ptr<server_task_result_error,std::default_delete<server_task_result_error>,void>
            ((unique_ptr<server_task_result,_std::default_delete<server_task_result>_> *)
             CONCAT44(local_1c,local_c),__u);
  server_response::send(this_00,(int)__u,__buf,__n,in_R8D);
  httplib::detail::std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>::
  ~unique_ptr((unique_ptr<server_task_result,_std::default_delete<server_task_result>_> *)
              CONCAT44(local_1c,local_c));
  httplib::detail::std::
  unique_ptr<server_task_result_error,_std::default_delete<server_task_result_error>_>::~unique_ptr
            ((unique_ptr<server_task_result_error,_std::default_delete<server_task_result_error>_> *
             )this_00);
  return;
}

Assistant:

void send_error(const int id_task, const std::string & error, const enum error_type type = ERROR_TYPE_SERVER) {
        SRV_ERR("task id = %d, error: %s\n", id_task, error.c_str());

        auto res = std::make_unique<server_task_result_error>();
        res->id       = id_task;
        res->err_type = type;
        res->err_msg  = error;

        queue_results.send(std::move(res));
    }